

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O2

void __thiscall Network::remove_link(Network *this,uint node_i,uint node_j)

{
  size_type sVar1;
  undefined8 local_28;
  
  local_28 = CONCAT44(node_i,node_j);
  sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    ((this->links).
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + node_i,(key_type *)&local_28);
  if (sVar1 == 1) {
    update_triangles(this,node_i,(uint)local_28,false);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->links).
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[node_i]._M_t,(key_type *)&local_28);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->links).
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_28 & 0xffffffff]._M_t,
            (key_type *)((long)&local_28 + 4));
    return;
  }
  __assert_fail("links[node_i].count(node_j) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                ,0xb9,"void Network::remove_link(unsigned int, unsigned int)");
}

Assistant:

void remove_link(unsigned int node_i, unsigned int node_j) {
        assert(links[node_i].count(node_j) == 1);  // link must exist

        update_triangles(node_i, node_j, false);

        links[node_i].erase(node_j);
        links[node_j].erase(node_i);
    }